

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O3

void Am_Gesture_Start_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object feedback;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Point_List local_18;
  
  local_30.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0xdc,0);
  Am_Object::operator=(&local_30,pAVar2);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0xb2,0);
    Am_Point_List::Am_Point_List(&local_18,pAVar2);
    value = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_18);
    Am_Object::Set(&local_30,0xb2,value,0);
    Am_Point_List::~Am_Point_List(&local_18);
    Am_Check_And_Fix_Feedback_Group(&local_20,&local_30);
    Am_Object::~Am_Object(&local_20);
    Am_Object::Set(&local_30,0x69,true,0);
    Am_Object::Am_Object(&local_28,&local_30);
    Am_To_Top(&local_28);
    Am_Object::~Am_Object(&local_28);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Gesture_Start_Do, (Am_Object inter))
{
  Am_Object feedback;
  feedback = inter.Get(Am_FEEDBACK_OBJECT);
  if (feedback.Valid()) {
    feedback.Set(Am_POINT_LIST, (Am_Point_List)inter.Get(Am_POINT_LIST));
    //move feedback object to new group if necessary
    Am_Check_And_Fix_Feedback_Group(feedback, inter);
    feedback.Set(Am_VISIBLE, true);
    Am_To_Top(feedback);
#ifdef DEBUG
    if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING))
      Am_Report_Set_Vis(inter, feedback, true);
#endif
  }
}